

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromFileTTF
          (ImFontAtlas *this,char *filename,float size_pixels,ImFontConfig *font_cfg_template,
          ImWchar *glyph_ranges)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  char *pcVar5;
  ImFont *pIVar6;
  size_t data_size;
  ImFontConfig font_cfg;
  size_t local_160;
  float local_158;
  undefined1 local_140 [12];
  undefined1 local_134;
  undefined8 local_128;
  undefined4 local_fc;
  undefined4 local_f0;
  undefined2 local_ec;
  char local_ea [50];
  ImFontConfig local_b8;
  
  local_160 = 0;
  pIVar6 = (ImFont *)0x0;
  local_158 = size_pixels;
  pvVar3 = ImFileLoadToMemory(filename,"rb",&local_160,0);
  if (pvVar3 != (void *)0x0) {
    if (font_cfg_template == (ImFontConfig *)0x0) {
      memset(local_140,0,0x88);
      local_134 = 1;
      local_128 = 0x100000003;
      local_fc = 0x7f7fffff;
      local_f0 = 0x3f800000;
      local_ec = 0xffff;
    }
    else {
      memcpy(local_140,font_cfg_template,0x88);
    }
    if (local_ea[0] == '\0') {
      sVar4 = strlen(filename);
      pcVar5 = filename + sVar4;
      do {
        if ((pcVar5 <= filename) || (pcVar1 = pcVar5 + -1, *pcVar1 == '\\')) break;
        pcVar5 = pcVar5 + -1;
      } while (*pcVar1 != '/');
      ImFormatString(local_ea,0x28,"%s, %.0fpx",(double)local_158);
    }
    iVar2 = (int)local_160;
    memcpy(&local_b8,local_140,0x88);
    local_b8.FontDataSize = iVar2;
    local_b8.SizePixels =
         (float)(~-(uint)(0.0 < local_158) & (uint)local_b8.SizePixels |
                (uint)local_158 & -(uint)(0.0 < local_158));
    if (glyph_ranges != (ImWchar *)0x0) {
      local_b8.GlyphRanges = glyph_ranges;
    }
    local_b8.FontData = pvVar3;
    pIVar6 = AddFont(this,&local_b8);
  }
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromFileTTF(const char* filename, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    size_t data_size = 0;
    void* data = ImFileLoadToMemory(filename, "rb", &data_size, 0);
    if (!data)
    {
        IM_ASSERT_USER_ERROR(0, "Could not load font file!");
        return NULL;
    }
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    if (font_cfg.Name[0] == '\0')
    {
        // Store a short copy of filename into into the font name for convenience
        const char* p;
        for (p = filename + strlen(filename); p > filename && p[-1] != '/' && p[-1] != '\\'; p--) {}
        ImFormatString(font_cfg.Name, IM_ARRAYSIZE(font_cfg.Name), "%s, %.0fpx", p, size_pixels);
    }
    return AddFontFromMemoryTTF(data, (int)data_size, size_pixels, &font_cfg, glyph_ranges);
}